

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::MethodDescriptorProto::InternalSwap
          (MethodDescriptorProto *this,MethodDescriptorProto *other)

{
  InternalMetadata *this_00;
  uint32 uVar1;
  void *pvVar2;
  MethodOptions *pMVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  string *psVar8;
  UnknownFieldSet *other_00;
  Arena *arena;
  Arena *pAVar9;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  pvVar2 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) == 0) {
    if (((ulong)pvVar2 & 1) == 0) {
      uVar7 = 0;
      goto LAB_002d0d6b;
    }
LAB_002d0d4e:
    other_00 = (UnknownFieldSet *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8);
  }
  else {
    if (((ulong)pvVar2 & 1) != 0) goto LAB_002d0d4e;
    other_00 = internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         (&(other->super_Message).super_MessageLite._internal_metadata_);
  }
  internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>(this_00,other_00);
  arena = (Arena *)this_00->ptr_;
  uVar7 = (uint)arena & 1;
LAB_002d0d6b:
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  pAVar9 = arena;
  if (uVar7 != 0) {
    pAVar9 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->name_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->name_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar8 = internal::ArenaStringPtr::Mutable
                       (&this->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
                        pAVar9);
    internal::ArenaStringPtr::Mutable
              (&other->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,pAVar9);
    std::__cxx11::string::swap((string *)psVar8);
    arena = (Arena *)this_00->ptr_;
    uVar7 = (uint)arena & 1;
  }
  pAVar9 = arena;
  if (uVar7 != 0) {
    pAVar9 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->input_type_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->input_type_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar8 = internal::ArenaStringPtr::Mutable
                       (&this->input_type_,
                        (string *)&internal::fixed_address_empty_string_abi_cxx11_,pAVar9);
    internal::ArenaStringPtr::Mutable
              (&other->input_type_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,pAVar9
              );
    std::__cxx11::string::swap((string *)psVar8);
    arena = (Arena *)this_00->ptr_;
    uVar7 = (uint)arena & 1;
  }
  if (uVar7 != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->output_type_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->output_type_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar8 = internal::ArenaStringPtr::Mutable
                       (&this->output_type_,
                        (string *)&internal::fixed_address_empty_string_abi_cxx11_,arena);
    internal::ArenaStringPtr::Mutable
              (&other->output_type_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,arena
              );
    std::__cxx11::string::swap((string *)psVar8);
  }
  pMVar3 = this->options_;
  this->options_ = other->options_;
  other->options_ = pMVar3;
  bVar5 = this->client_streaming_;
  bVar6 = this->server_streaming_;
  bVar4 = other->server_streaming_;
  this->client_streaming_ = other->client_streaming_;
  this->server_streaming_ = bVar4;
  other->client_streaming_ = bVar5;
  other->server_streaming_ = bVar6;
  return;
}

Assistant:

void MethodDescriptorProto::InternalSwap(MethodDescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  input_type_.Swap(&other->input_type_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  output_type_.Swap(&other->output_type_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(MethodDescriptorProto, server_streaming_)
      + sizeof(MethodDescriptorProto::server_streaming_)
      - PROTOBUF_FIELD_OFFSET(MethodDescriptorProto, options_)>(
          reinterpret_cast<char*>(&options_),
          reinterpret_cast<char*>(&other->options_));
}